

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O1

bool __thiscall MemoryManager::addPage(MemoryManager *this,uint32_t addr)

{
  uint8_t *puVar1;
  uint8_t **ppuVar2;
  void *pvVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = addr >> 0x16;
  uVar6 = addr >> 0xc & 0x3ff;
  if (this->memory[uVar5] == (uint8_t **)0x0) {
    ppuVar2 = (uint8_t **)operator_new__(0x2000);
    this->memory[uVar5] = ppuVar2;
    memset(ppuVar2,0,0x2000);
  }
  ppuVar2 = this->memory[uVar5];
  puVar1 = ppuVar2[uVar6];
  if (puVar1 == (uint8_t *)0x0) {
    pvVar3 = operator_new__(0x1000);
    uVar4 = (ulong)(uVar6 << 3);
    *(void **)((long)ppuVar2 + uVar4) = pvVar3;
    memset(*(void **)((long)this->memory[uVar5] + uVar4),0,0x1000);
  }
  else {
    dbgprintf("Addr 0x%x already exists and do not need an addPage()!\n",addr);
  }
  return puVar1 == (uint8_t *)0x0;
}

Assistant:

bool MemoryManager::addPage(uint32_t addr) {
  uint32_t i = this->getFirstEntryId(addr);
  uint32_t j = this->getSecondEntryId(addr);
  if (this->memory[i] == nullptr) {
    this->memory[i] = new uint8_t *[1024];
    memset(this->memory[i], 0, sizeof(uint8_t *) * 1024);
  }
  if (this->memory[i][j] == nullptr) {
    this->memory[i][j] = new uint8_t[4096];
    memset(this->memory[i][j], 0, 4096);
  } else {
    dbgprintf("Addr 0x%x already exists and do not need an addPage()!\n", addr);
    return false;
  }
  return true;
}